

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  ARKodeARKStepMem step_mem_00;
  undefined8 uVar1;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  int iVar4;
  undefined8 *in_RSI;
  long in_RDI;
  bool bVar5;
  undefined8 uVar6;
  ARKodeARKStepMem step_mem;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  int stiffly_accurate;
  sunrealtype *dj;
  sunrealtype *bj;
  sunrealtype *cj;
  N_Vector yerr;
  N_Vector y;
  int nvec;
  int j;
  int retval;
  sunrealtype *local_50;
  sunrealtype *local_48;
  sunrealtype *local_40;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 *local_18;
  long local_10;
  int local_4;
  
  if (*(long *)(in_RDI + 0x88) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xc65,"arkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    step_mem_00 = *(ARKodeARKStepMem *)(in_RDI + 0x88);
    uVar6 = *(undefined8 *)(in_RDI + 0x248);
    uVar1 = *(undefined8 *)(in_RDI + 0x268);
    psVar2 = step_mem_00->cvals;
    pp_Var3 = step_mem_00->Xvecs;
    *in_RSI = 0;
    bVar5 = true;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (step_mem_00->explicit != 0) {
      iVar4 = ARKodeButcherTable_IsStifflyAccurate(step_mem_00->Be);
      bVar5 = iVar4 != 0;
    }
    if ((step_mem_00->implicit != 0) &&
       (iVar4 = ARKodeButcherTable_IsStifflyAccurate(step_mem_00->Bi), iVar4 == 0)) {
      bVar5 = false;
    }
    if (!bVar5) {
      *psVar2 = 1.0;
      *pp_Var3 = *(N_Vector *)(local_10 + 0x250);
      local_24 = 1;
      for (local_20 = 0; local_20 < step_mem_00->stages; local_20 = local_20 + 1) {
        if (step_mem_00->explicit != 0) {
          psVar2[local_24] = *(double *)(local_10 + 0x2c0) * step_mem_00->Be->b[local_20];
          pp_Var3[local_24] = step_mem_00->Fe[local_20];
          local_24 = local_24 + 1;
        }
        if (step_mem_00->implicit != 0) {
          psVar2[local_24] = *(double *)(local_10 + 0x2c0) * step_mem_00->Bi->b[local_20];
          pp_Var3[local_24] = step_mem_00->Fi[local_20];
          local_24 = local_24 + 1;
        }
      }
      if ((step_mem_00->expforcing != 0) || (step_mem_00->impforcing != 0)) {
        if (step_mem_00->expforcing == 0) {
          local_40 = step_mem_00->Bi->c;
          local_48 = step_mem_00->Bi->b;
        }
        else {
          local_40 = step_mem_00->Be->c;
          local_48 = step_mem_00->Be->b;
        }
        for (local_20 = 0; local_20 < step_mem_00->stages; local_20 = local_20 + 1) {
          step_mem_00->stage_times[local_20] =
               local_40[local_20] * *(double *)(local_10 + 0x2c0) + *(double *)(local_10 + 0x380);
          step_mem_00->stage_coefs[local_20] = *(double *)(local_10 + 0x2c0) * local_48[local_20];
        }
        arkStep_ApplyForcing
                  (step_mem_00,step_mem_00->stage_times,step_mem_00->stage_coefs,step_mem_00->stages
                   ,&local_24);
      }
      iVar4 = N_VLinearCombination(local_24,psVar2,pp_Var3,uVar6);
      if (iVar4 != 0) {
        return -0x1c;
      }
      local_1c = 0;
    }
    if ((*(int *)(local_10 + 0x300) == 0) || (*(int *)(local_10 + 0x3a0) != 0)) {
      local_24 = 0;
      for (local_20 = 0; local_20 < step_mem_00->stages; local_20 = local_20 + 1) {
        if (step_mem_00->explicit != 0) {
          psVar2[local_24] =
               *(double *)(local_10 + 0x2c0) *
               (step_mem_00->Be->b[local_20] - step_mem_00->Be->d[local_20]);
          pp_Var3[local_24] = step_mem_00->Fe[local_20];
          local_24 = local_24 + 1;
        }
        if (step_mem_00->implicit != 0) {
          psVar2[local_24] =
               *(double *)(local_10 + 0x2c0) *
               (step_mem_00->Bi->b[local_20] - step_mem_00->Bi->d[local_20]);
          pp_Var3[local_24] = step_mem_00->Fi[local_20];
          local_24 = local_24 + 1;
        }
      }
      if ((step_mem_00->expforcing != 0) || (step_mem_00->impforcing != 0)) {
        if (step_mem_00->expforcing == 0) {
          local_40 = step_mem_00->Bi->c;
          local_48 = step_mem_00->Bi->b;
          local_50 = step_mem_00->Bi->d;
        }
        else {
          local_40 = step_mem_00->Be->c;
          local_48 = step_mem_00->Be->b;
          local_50 = step_mem_00->Be->d;
        }
        for (local_20 = 0; local_20 < step_mem_00->stages; local_20 = local_20 + 1) {
          step_mem_00->stage_times[local_20] =
               local_40[local_20] * *(double *)(local_10 + 0x2c0) + *(double *)(local_10 + 0x380);
          step_mem_00->stage_coefs[local_20] =
               *(double *)(local_10 + 0x2c0) * (local_48[local_20] - local_50[local_20]);
        }
        arkStep_ApplyForcing
                  (step_mem_00,step_mem_00->stage_times,step_mem_00->stage_coefs,step_mem_00->stages
                   ,&local_24);
      }
      local_1c = N_VLinearCombination(local_24,psVar2,pp_Var3,uVar1);
      if (local_1c != 0) {
        return -0x1c;
      }
      uVar6 = N_VWrmsNorm(uVar1,*(undefined8 *)(local_10 + 0x230));
      *local_18 = uVar6;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cj;
  sunrealtype* bj;
  sunrealtype* dj;
  sunbooleantype stiffly_accurate;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts, and shortcut to time at end of step */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* check if the method is stiffly accurate */
  stiffly_accurate = SUNTRUE;

  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* If the method is stiffly accurate, ycur is already the new solution */

  if (!stiffly_accurate)
  {
    /* Compute time step solution (if necessary) */
    /*   set arrays for fused vector operation */
    cvals[0] = ONE;
    Xvecs[0] = ark_mem->yn;
    nvec     = 1;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Be->b[j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * step_mem->Bi->b[j];
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (step_mem->expforcing)
      {
        cj = step_mem->Be->c;
        bj = step_mem->Be->b;
      }
      else
      {
        cj = step_mem->Bi->c;
        bj = step_mem->Bi->b;
      }

      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h * bj[j];
      }

      arkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /*   call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

  /* Compute yerr (if temporal error estimation is enabled). */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      if (step_mem->explicit)
      { /* Explicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Be->b[j] - step_mem->Be->d[j]);
        Xvecs[nvec] = step_mem->Fe[j];
        nvec += 1;
      }
      if (step_mem->implicit)
      { /* Implicit pieces */
        cvals[nvec] = ark_mem->h * (step_mem->Bi->b[j] - step_mem->Bi->d[j]);
        Xvecs[nvec] = step_mem->Fi[j];
        nvec += 1;
      }
    }

    /* apply external polynomial (MRI) forcing (M = I required) */
    if (step_mem->expforcing || step_mem->impforcing)
    {
      if (step_mem->expforcing)
      {
        cj = step_mem->Be->c;
        bj = step_mem->Be->b;
        dj = step_mem->Be->d;
      }
      else
      {
        cj = step_mem->Bi->c;
        bj = step_mem->Bi->b;
        dj = step_mem->Bi->d;
      }

      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h * (bj[j] - dj[j]);
      }

      arkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}